

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O2

void __thiscall cmQtAutoGenerator::Logger::Info(Logger *this,GenT genType,string_view message)

{
  size_t sVar1;
  lock_guard<std::mutex> lock;
  string msg;
  string_view local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  char *local_40;
  string local_38;
  
  sVar1 = message._M_len;
  local_50._M_len = sVar1;
  local_50._M_str = message._M_str;
  local_60 = cmQtAutoGen::GeneratorName(genType);
  if (sVar1 == 0) {
    local_40 = "\n";
  }
  else {
    local_40 = "\n";
    if (message._M_str[sVar1 - 1] == '\n') {
      local_40 = "";
    }
  }
  cmStrCat<std::basic_string_view<char,std::char_traits<char>>,char_const(&)[3],std::basic_string_view<char,std::char_traits<char>>&,char_const*>
            (&local_38,&local_60,(char (*) [3])0x6b7b5a,&local_50,&local_40);
  std::mutex::lock(&this->Mutex_);
  cmSystemTools::Stdout(&local_38);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void cmQtAutoGenerator::Logger::Info(GenT genType,
                                     cm::string_view message) const
{
  std::string msg = cmStrCat(GeneratorName(genType), ": ", message,
                             cmHasSuffix(message, '\n') ? "" : "\n");
  {
    std::lock_guard<std::mutex> lock(this->Mutex_);
    cmSystemTools::Stdout(msg);
  }
}